

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ErrorList.cpp
# Opt level: O0

void __thiscall
amrex::ErrorList::add(ErrorList *this,string *name,int nextra,ErrorType typ,ErrorFunc *func)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  ErrorFunc *in_RSI;
  unique_ptr<amrex::ErrorRec,_std::default_delete<amrex::ErrorRec>_> *in_RDI;
  int *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  int n;
  Vector<std::unique_ptr<amrex::ErrorRec,_std::default_delete<amrex::ErrorRec>_>,_std::allocator<std::unique_ptr<amrex::ErrorRec,_std::default_delete<amrex::ErrorRec>_>_>_>
  *in_stack_ffffffffffffffd0;
  unique_ptr<amrex::ErrorRec,_std::default_delete<amrex::ErrorRec>_> *__args_2;
  
  __args_2 = in_RDI;
  Vector<std::unique_ptr<amrex::ErrorRec,_std::default_delete<amrex::ErrorRec>_>,_std::allocator<std::unique_ptr<amrex::ErrorRec,_std::default_delete<amrex::ErrorRec>_>_>_>
  ::size((Vector<std::unique_ptr<amrex::ErrorRec,_std::default_delete<amrex::ErrorRec>_>,_std::allocator<std::unique_ptr<amrex::ErrorRec,_std::default_delete<amrex::ErrorRec>_>_>_>
          *)0x10568f9);
  std::
  vector<std::unique_ptr<amrex::ErrorRec,_std::default_delete<amrex::ErrorRec>_>,_std::allocator<std::unique_ptr<amrex::ErrorRec,_std::default_delete<amrex::ErrorRec>_>_>_>
  ::resize((vector<std::unique_ptr<amrex::ErrorRec,_std::default_delete<amrex::ErrorRec>_>,_std::allocator<std::unique_ptr<amrex::ErrorRec,_std::default_delete<amrex::ErrorRec>_>_>_>
            *)in_RSI,CONCAT44(in_EDX,in_ECX));
  std::
  make_unique<amrex::ErrorRec,std::__cxx11::string_const&,int&,amrex::ErrorRec::ErrorType&,amrex::ErrorRec::ErrorFunc_const&>
            (in_stack_00000008,unaff_retaddr,(ErrorType *)__args_2,in_RSI);
  Vector<std::unique_ptr<amrex::ErrorRec,_std::default_delete<amrex::ErrorRec>_>,_std::allocator<std::unique_ptr<amrex::ErrorRec,_std::default_delete<amrex::ErrorRec>_>_>_>
  ::operator[](in_stack_ffffffffffffffd0,(size_type)in_RDI);
  std::unique_ptr<amrex::ErrorRec,_std::default_delete<amrex::ErrorRec>_>::operator=
            ((unique_ptr<amrex::ErrorRec,_std::default_delete<amrex::ErrorRec>_> *)
             in_stack_ffffffffffffffd0,in_RDI);
  std::unique_ptr<amrex::ErrorRec,_std::default_delete<amrex::ErrorRec>_>::~unique_ptr
            ((unique_ptr<amrex::ErrorRec,_std::default_delete<amrex::ErrorRec>_> *)
             in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void
ErrorList::add (const std::string&         name,
                int                        nextra,
                ErrorRec::ErrorType        typ,
                const ErrorRec::ErrorFunc& func)
{
    //
    // Keep list in order of definition, append().
    //
    int n = vec.size();
    vec.resize(n+1);
    vec[n] = std::make_unique<ErrorRec>(name, nextra, typ, func);
}